

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  _GLFWjoystick *p_Var5;
  char *in_RDI;
  uint buttonCount_00;
  int iVar6;
  _GLFWjoystick *js;
  int code_1;
  int code;
  int hatCount;
  int buttonCount;
  int axisCount;
  char guid [33];
  char name [256];
  input_id id;
  char absBits [8];
  char keyBits [96];
  char evBits [4];
  _GLFWjoystickLinux linjs;
  int jid;
  int in_stack_ffffffffffffde7c;
  int in_stack_ffffffffffffde84;
  int in_stack_ffffffffffffde8c;
  undefined4 in_stack_ffffffffffffde94;
  int in_stack_ffffffffffffde98;
  undefined4 in_stack_ffffffffffffde9c;
  int local_212c;
  int local_2128;
  int local_2124;
  int local_2120;
  int local_211c;
  char local_2118 [48];
  char local_20e8;
  char local_20e7;
  char local_20e6;
  char local_20e5;
  char local_20e4;
  char local_20e3;
  char local_20e2;
  ushort local_1fe8;
  ushort local_1fe6;
  ushort local_1fe4;
  ushort local_1fe2;
  char local_1fe0 [8];
  char local_1fd8 [108];
  byte local_1f6c [4];
  int local_1f68;
  char acStack_1f64 [684];
  int aiStack_f64 [528];
  int aiStack_724 [48];
  undefined1 auStack_664 [1568];
  int local_44;
  char *local_40;
  GLFWbool local_34;
  
  local_44 = 0;
  local_40 = in_RDI;
  while( true ) {
    if (0xf < local_44) {
      memset(&local_1f68,0,0x1f24);
      local_1f68 = open(local_40,0x800);
      if (local_1f68 == -1) {
        local_34 = 0;
      }
      else {
        memset(local_1f6c,0,4);
        memset(local_1fd8,0,0x60);
        memset(local_1fe0,0,8);
        iVar1 = ioctl(local_1f68,0x80044520,local_1f6c);
        if ((((iVar1 < 0) || (iVar1 = ioctl(local_1f68,0x80604521,local_1fd8), iVar1 < 0)) ||
            (iVar1 = ioctl(local_1f68,0x80084523,local_1fe0), iVar1 < 0)) ||
           (iVar1 = ioctl(local_1f68,0x80084502,&local_1fe8), iVar1 < 0)) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          _glfwInputError(0x10008,"Linux: Failed to query input device: %s",pcVar4);
          close(local_1f68);
          local_34 = 0;
        }
        else if (((local_1f6c[0] & 2) == 0) || ((local_1f6c[0] & 8) == 0)) {
          close(local_1f68);
          local_34 = 0;
        }
        else {
          memset(&local_20e8,0,0x100);
          iVar1 = ioctl(local_1f68,0x81004506,&local_20e8);
          if (iVar1 < 0) {
            strncpy(&local_20e8,"Unknown",0x100);
          }
          memset(local_2118,0,0x21);
          if (((local_1fe6 == 0) || (local_1fe4 == 0)) || (local_1fe2 == 0)) {
            iVar6 = (int)local_20e5;
            buttonCount_00 = (uint)local_20e4;
            iVar1 = (int)local_20e3;
            in_stack_ffffffffffffde98 = (int)local_20e2;
            sprintf(local_2118,"%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                    (ulong)(local_1fe8 & 0xff),(ulong)(uint)((int)(uint)local_1fe8 >> 8),
                    (ulong)(uint)(int)local_20e8,(ulong)(uint)(int)local_20e7,(int)local_20e6);
          }
          else {
            iVar6 = (int)(uint)local_1fe4 >> 8;
            buttonCount_00 = local_1fe2 & 0xff;
            iVar1 = (int)(uint)local_1fe2 >> 8;
            sprintf(local_2118,"%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                    (ulong)(local_1fe8 & 0xff),(ulong)(uint)((int)(uint)local_1fe8 >> 8),
                    (ulong)(local_1fe6 & 0xff),(ulong)(uint)((int)(uint)local_1fe6 >> 8),
                    local_1fe4 & 0xff);
          }
          local_211c = 0;
          local_2120 = 0;
          local_2124 = 0;
          for (local_2128 = 0x100; local_2128 < 0x300; local_2128 = local_2128 + 1) {
            if (((int)local_1fd8[local_2128 / 8] & 1 << ((byte)((long)local_2128 % 8) & 0x1f)) != 0)
            {
              aiStack_f64[local_2128 + -0x100] = local_2120;
              local_2120 = local_2120 + 1;
            }
          }
          for (local_212c = 0; local_212c < 0x40; local_212c = local_212c + 1) {
            aiStack_724[(long)local_212c + -0x10] = -1;
            if (((int)local_1fe0[local_212c / 8] & 1 << ((byte)((long)local_212c % 8) & 0x1f)) != 0)
            {
              if ((local_212c < 0x10) || (0x17 < local_212c)) {
                iVar2 = ioctl(local_1f68,(ulong)(local_212c + 0x40U | 0x80004500) | 0x180000,
                              auStack_664 + (long)local_212c * 0x18);
                if (-1 < iVar2) {
                  aiStack_724[(long)local_212c + -0x10] = local_211c;
                  local_211c = local_211c + 1;
                }
              }
              else {
                aiStack_724[(long)local_212c + -0x10] = local_2124;
                local_2124 = local_2124 + 1;
                local_212c = local_212c + 1;
              }
            }
          }
          p_Var5 = _glfwAllocJoystick((char *)CONCAT44(in_stack_ffffffffffffde9c,
                                                       in_stack_ffffffffffffde98),
                                      (char *)CONCAT44(in_stack_ffffffffffffde94,iVar1),
                                      in_stack_ffffffffffffde8c,buttonCount_00,
                                      in_stack_ffffffffffffde84);
          if (p_Var5 == (_GLFWjoystick *)0x0) {
            close(local_1f68);
            local_34 = 0;
          }
          else {
            strncpy(acStack_1f64,local_40,0xfff);
            memcpy(&p_Var5->linjs,&local_1f68,0x1f24);
            pollAbsState((_GLFWjoystick *)CONCAT44(in_stack_ffffffffffffde84,iVar6));
            _glfwInputJoystick((_GLFWjoystick *)CONCAT44(in_stack_ffffffffffffde84,iVar6),
                               in_stack_ffffffffffffde7c);
            local_34 = 1;
          }
        }
      }
      return local_34;
    }
    if ((_glfw.joysticks[local_44].present != 0) &&
       (iVar1 = strcmp(_glfw.joysticks[local_44].linjs.path,local_40), iVar1 == 0)) break;
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    for (int jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (!_glfw.joysticks[jid].present)
            continue;
        if (strcmp(_glfw.joysticks[jid].linjs.path, path) == 0)
            return GLFW_FALSE;
    }

    _GLFWjoystickLinux linjs = {0};
    linjs.fd = open(path, O_RDONLY | O_NONBLOCK);
    if (linjs.fd == -1)
        return GLFW_FALSE;

    char evBits[(EV_CNT + 7) / 8] = {0};
    char keyBits[(KEY_CNT + 7) / 8] = {0};
    char absBits[(ABS_CNT + 7) / 8] = {0};
    struct input_id id;

    if (ioctl(linjs.fd, EVIOCGBIT(0, sizeof(evBits)), evBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_KEY, sizeof(keyBits)), keyBits) < 0 ||
        ioctl(linjs.fd, EVIOCGBIT(EV_ABS, sizeof(absBits)), absBits) < 0 ||
        ioctl(linjs.fd, EVIOCGID, &id) < 0)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR,
                        "Linux: Failed to query input device: %s",
                        strerror(errno));
        close(linjs.fd);
        return GLFW_FALSE;
    }

    // Ensure this device supports the events expected of a joystick
    if (!isBitSet(EV_KEY, evBits) || !isBitSet(EV_ABS, evBits))
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    char name[256] = "";

    if (ioctl(linjs.fd, EVIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    char guid[33] = "";

    // Generate a joystick GUID that matches the SDL 2.0.5+ one
    if (id.vendor && id.product && id.version)
    {
        sprintf(guid, "%02x%02x0000%02x%02x0000%02x%02x0000%02x%02x0000",
                id.bustype & 0xff, id.bustype >> 8,
                id.vendor & 0xff,  id.vendor >> 8,
                id.product & 0xff, id.product >> 8,
                id.version & 0xff, id.version >> 8);
    }
    else
    {
        sprintf(guid, "%02x%02x0000%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x00",
                id.bustype & 0xff, id.bustype >> 8,
                name[0], name[1], name[2], name[3],
                name[4], name[5], name[6], name[7],
                name[8], name[9], name[10]);
    }

    int axisCount = 0, buttonCount = 0, hatCount = 0;

    for (int code = BTN_MISC;  code < KEY_CNT;  code++)
    {
        if (!isBitSet(code, keyBits))
            continue;

        linjs.keyMap[code - BTN_MISC] = buttonCount;
        buttonCount++;
    }

    for (int code = 0;  code < ABS_CNT;  code++)
    {
        linjs.absMap[code] = -1;
        if (!isBitSet(code, absBits))
            continue;

        if (code >= ABS_HAT0X && code <= ABS_HAT3Y)
        {
            linjs.absMap[code] = hatCount;
            hatCount++;
            // Skip the Y axis
            code++;
        }
        else
        {
            if (ioctl(linjs.fd, EVIOCGABS(code), &linjs.absInfo[code]) < 0)
                continue;

            linjs.absMap[code] = axisCount;
            axisCount++;
        }
    }

    _GLFWjoystick* js =
        _glfwAllocJoystick(name, guid, axisCount, buttonCount, hatCount);
    if (!js)
    {
        close(linjs.fd);
        return GLFW_FALSE;
    }

    strncpy(linjs.path, path, sizeof(linjs.path) - 1);
    memcpy(&js->linjs, &linjs, sizeof(linjs));

    pollAbsState(js);

    _glfwInputJoystick(js, GLFW_CONNECTED);
    return GLFW_TRUE;
}